

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O2

token * dmrC_primary_expression(dmr_C *C,token *token,expression **tree)

{
  byte bVar1;
  char cVar2;
  undefined8 *puVar3;
  byte bVar4;
  undefined8 uVar5;
  unsigned_long_long uVar6;
  size_t sVar7;
  uint uVar8;
  int iVar9;
  __int32_t **pp_Var10;
  expression_list *sym;
  expression *peVar11;
  position pVar12;
  ulonglong uVar13;
  string *psVar14;
  undefined1 *puVar15;
  expression *peVar16;
  token *ptVar17;
  symbol *psVar18;
  bool bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  char *pcVar24;
  char *pcVar25;
  expression **ppeVar26;
  uint size;
  position pVar27;
  expression *peVar28;
  global_symbols_t *pgVar29;
  target_t *ptVar30;
  ident *ident;
  bool bVar31;
  bool bVar32;
  longdouble in_ST0;
  symbol *local_60;
  size_t local_58;
  size_t local_50;
  expression *local_48;
  expression *expr;
  expression **local_38;
  
  pVar12 = token->pos;
  switch(pVar12._0_4_ & 0x3f) {
  case 2:
    local_38 = tree;
    sym = (expression_list *)dmrC_lookup_symbol((token->field_2).ident,NS_SYMBOL|NS_TYPEDEF);
    pVar12 = (position)token->next;
    if (sym == (expression_list *)0x0) {
      ident = (token->field_2).ident;
      pgVar29 = C->S;
      if ((((ident == pgVar29->__func___ident) || (ident == pgVar29->__FUNCTION___ident)) ||
          (ident == pgVar29->__PRETTY_FUNCTION___ident)) &&
         ((C->current_fn != (symbol *)0x0 && (C->current_fn->ident != (ident *)0x0)))) {
        expr = (expression *)dmrC_alloc_symbol(pgVar29,token->pos,6);
        (((symbol *)expr)->field_14).field_2.ctype.base_type = &C->S->char_ctype;
        (((symbol *)expr)->field_14).field_2.ctype.alignment = 1;
        ((symbol *)expr)->endpos = token->pos;
        sym = (expression_list *)dmrC_alloc_symbol(C->S,token->pos,3);
        sym->list_[0xc] = expr;
        sym->list_[9] = (expression *)0x1;
        sym->list_[8] = (expression *)0x4;
        *(position *)((long)&sym->prev_ + 4) = token->pos;
        dmrC_bind_symbol(C->S,(symbol *)sym,ident,NS_LABEL);
        *(uint *)sym = *(uint *)sym & 0xfffe00ff | 0x1000;
        local_58 = (size_t)C->current_fn->ident->len;
        local_50 = local_58 + 1;
        psVar14 = (string *)dmrC_allocator_allocate(&C->string_allocator,local_50);
        memcpy(psVar14 + 1,&C->current_fn->ident->field_0x12,local_58);
        *(undefined1 *)((long)&psVar14[1].field_0x0 + local_58) = 0;
        *psVar14 = (string)(((uint)*psVar14 & 0x80000000) + (int)local_50);
        peVar11 = dmrC_alloc_expression(C,token->pos,2);
        sym->list_[0x12] = peVar11;
        (peVar11->field_5).field_2.string = psVar14;
        *(expression_list **)((long)sym->list_[0x12] + 0x10) = sym;
        pVar27 = token->pos;
        puVar15 = (undefined1 *)dmrC_allocator_allocate(&C->expression_allocator,0);
        *puVar15 = 1;
        *(position *)(puVar15 + 8) = pVar27;
        *(size_t *)(puVar15 + 0x20) = local_50;
        *(symbol **)(puVar15 + 0x10) = &C->S->int_ctype;
        sym->list_[7] = (expression *)puVar15;
        *(undefined1 **)&expr[1].field_0x18 = puVar15;
        iVar9 = C->target->bits_in_char * (int)local_50;
        *(int *)&expr[1].ctype = iVar9;
        *(int *)(sym->list_ + 6) = iVar9;
        ident = (ident *)(token->field_2).number;
        pgVar29 = C->S;
      }
      else {
        sym = (expression_list *)0x0;
      }
      if (ident == pgVar29->__builtin_types_compatible_p_ident) {
        peVar11 = dmrC_alloc_expression(C,token->pos,0x16);
        peVar11->field_0x1 = 1;
        peVar11->op = 0x10a;
        ptVar17 = token->next;
        if ((((ulong)ptVar17->pos & 0x3f) != 0x11) || ((ptVar17->field_2).special != 0x28)) {
          pVar12 = (position)dmrC_expect_token(C,ptVar17,0x28,"after __builtin_types_compatible_p");
          peVar11 = (expression *)0x0;
          tree = local_38;
          goto LAB_00107b2c;
        }
        pVar12 = (position)parse_type(C,ptVar17->next,(expression **)&(peVar11->field_5).statement);
        tree = local_38;
        if (((*(uint *)pVar12 & 0x3f) == 0x11) && (*(int *)((long)pVar12 + 0x10) == 0x2c)) {
          pVar12 = (position)
                   parse_type(C,*(token **)((long)pVar12 + 8),&(peVar11->field_5).field_6.right);
          if (((*(uint *)pVar12 & 0x3f) == 0x11) && (*(int *)((long)pVar12 + 0x10) == 0x29)) {
            pVar12 = *(position *)((long)pVar12 + 8);
            goto LAB_00107b2c;
          }
          pcVar24 = "at end of __builtin_types_compatible_p";
          iVar9 = 0x29;
        }
        else {
          pcVar24 = "in __builtin_types_compatible_p";
          iVar9 = 0x2c;
        }
      }
      else {
        if (ident != pgVar29->__builtin_offsetof_ident) goto LAB_0010801b;
        local_48 = (expression *)0x0;
        pVar12 = (position)token->next;
        if (((*(uint *)pVar12 & 0x3f) == 0x11) && (*(uint *)((long)pVar12 + 0x10) == 0x28)) {
          pVar12 = (position)dmrC_typename(C,*(token **)((long)pVar12 + 8),&local_60,(int *)0x0);
          if (local_60->ident != (ident *)0x0) {
            dmrC_sparse_error(C,*(position *)pVar12,
                              "type expression should not include identifier \"%s\"",
                              &local_60->ident->field_0x12);
          }
          pVar27 = *(position *)pVar12;
          if (((pVar27._0_4_ & 0x3f) == 0x11) && (*(int *)((long)pVar12 + 0x10) == 0x2c)) {
            iVar9 = 0x2e;
            ppeVar26 = &local_48;
            peVar11 = (expression *)0x0;
LAB_001081fc:
            if (iVar9 == 0x2e) {
LAB_00108231:
              pVar12 = *(position *)((long)pVar12 + 8);
              peVar16 = dmrC_alloc_expression(C,*(position *)pVar12,0x1e);
              peVar16->field_0x1 = 1;
              peVar16->op = 0x2e;
              if ((SUB84(*(position *)pVar12,0) & 0x3f) != 2) {
                peVar11 = (expression *)0x0;
                dmrC_sparse_error(C,*(position *)pVar12,"Expected member name");
                tree = local_38;
                goto LAB_00107b2c;
              }
              (peVar16->field_5).field_10.cond_false =
                   (expression *)*(position *)((long)pVar12 + 0x10);
              pVar12 = *(position *)((long)pVar12 + 8);
            }
            else {
              if (iVar9 != 0x5b) {
                if (iVar9 == 0x104) {
                  peVar16 = dmrC_alloc_expression(C,pVar27,0x1e);
                  peVar16->field_0x1 = 1;
                  peVar16->op = 0x5b;
                  *ppeVar26 = peVar16;
                  ppeVar26 = &(peVar16->field_5).field_6.right;
                  goto LAB_00108231;
                }
                if (iVar9 == 0x29) {
                  (local_48->field_5).field_4.symbol = local_60;
                  peVar11 = local_48;
                }
                else {
                  peVar11 = (expression *)0x0;
                }
                pcVar24 = "at end of __builtin_offset";
                iVar9 = 0x29;
                tree = local_38;
                goto LAB_00107fb7;
              }
              ptVar17 = *(token **)((long)pVar12 + 8);
              peVar16 = dmrC_alloc_expression(C,ptVar17->pos,0x1e);
              peVar16->field_0x1 = 1;
              peVar16->op = 0x5b;
              ptVar17 = comma_expression(C,ptVar17,&(peVar16->field_5).field_10.cond_false);
              pVar12 = (position)dmrC_expect_token(C,ptVar17,0x5d,"at end of array dereference");
              tree = local_38;
              if ((peVar16->field_5).field_10.cond_false == (expression *)0x0) goto LAB_00107b2c;
            }
            *ppeVar26 = peVar16;
            ppeVar26 = &(peVar16->field_5).field_6.right;
            pVar27 = *(position *)pVar12;
            iVar9 = 0;
            if ((pVar27._0_4_ & 0x3f) == 0x11) {
              iVar9 = *(int *)((long)pVar12 + 0x10);
            }
            goto LAB_001081fc;
          }
          pcVar24 = "in __builtin_offset";
          iVar9 = 0x2c;
          tree = local_38;
        }
        else {
          pcVar24 = "after __builtin_offset";
          iVar9 = 0x28;
          tree = local_38;
        }
      }
      pVar12 = (position)dmrC_expect_token(C,(token *)pVar12,iVar9,pcVar24);
      peVar11 = (expression *)0x0;
    }
    else {
      if ((sym->field_0x2 & 0x10) != 0) {
        peVar11 = dmrC_alloc_expression(C,token->pos,1);
        puVar3 = (undefined8 *)sym->list_[0x12];
        pVar27 = (position)puVar3[1];
        psVar18 = (symbol *)puVar3[2];
        uVar5 = puVar3[3];
        uVar6 = puVar3[4];
        psVar14 = (string *)puVar3[5];
        peVar16 = (expression *)puVar3[6];
        peVar28 = (expression *)puVar3[7];
        *(undefined8 *)peVar11 = *puVar3;
        peVar11->pos = pVar27;
        peVar11->ctype = psVar18;
        *(undefined8 *)&peVar11->field_0x18 = uVar5;
        (peVar11->field_5).field_0.value = uVar6;
        (peVar11->field_5).field_2.string = psVar14;
        (peVar11->field_5).field_10.cond_false = peVar16;
        (peVar11->field_5).field_14.ident_expression = peVar28;
        peVar11->pos = token->pos;
        peVar11->field_0x1 = 1;
        tree = local_38;
        goto LAB_00107b2c;
      }
LAB_0010801b:
      peVar11 = dmrC_alloc_expression(C,token->pos,3);
      if (sym == (expression_list *)0x0) {
        sym = (expression_list *)0x0;
      }
      else if (((undefined1  [264])*sym & (undefined1  [264])0x1ff00) == (undefined1  [264])0x200) {
        sym = (expression_list *)0x0;
        dmrC_sparse_error(C,token->pos,"typename in expression");
      }
      (peVar11->field_5).field_2.string = (string *)token->field_2;
      (peVar11->field_5).expr_list = sym;
      tree = local_38;
    }
    goto LAB_00107b2c;
  case 3:
    peVar11 = dmrC_alloc_expression(C,pVar12,3);
    peVar11->field_0x1 = 1;
    pgVar29 = C->S;
    peVar11->ctype = &pgVar29->int_ctype;
    (peVar11->field_5).field_3.unop = (expression *)&pgVar29->zero_int;
    (peVar11->field_5).field_2.string = (string *)token->field_2;
    break;
  case 4:
    local_38 = tree;
    peVar11 = dmrC_alloc_expression(C,pVar12,1);
    peVar16 = (expression *)(token->field_2).number;
    expr = (expression *)__errno_location();
    *(int *)expr = 0;
    if ((*(char *)peVar16 == '0') &&
       (pp_Var10 = __ctype_tolower_loc(), (*pp_Var10)[(byte)peVar16->field_0x1] == 0x62)) {
      iVar9 = 2;
      peVar28 = (expression *)&peVar16->field_0x2;
    }
    else {
      iVar9 = 0;
      peVar28 = peVar16;
    }
    uVar13 = strtoull((char *)peVar28,(char **)&local_48,iVar9);
    if (local_48 != peVar16) {
      bVar32 = true;
      if (uVar13 == 0xffffffffffffffff) {
        bVar32 = *(int *)expr != 0x22;
      }
      expr = (expression *)CONCAT71(expr._1_7_,bVar32);
      bVar4 = 0;
      uVar8 = 0;
      iVar9 = 0;
      bVar31 = true;
LAB_00107d0b:
      do {
        bVar19 = bVar31;
        peVar28 = local_48;
        local_48 = (expression *)&peVar28->field_0x1;
        bVar1 = *(byte *)peVar28;
        local_50 = uVar13;
        if (bVar1 == 0) {
          if (bVar32 == false) {
LAB_00108521:
            pcVar24 = dmrC_show_token(C,token);
            pVar12 = peVar11->pos;
            pcVar25 = "constant %s is too big even for unsigned long long";
            goto LAB_00108514;
          }
          bVar32 = (bool)(*(char *)peVar16 == '0' | bVar4);
          if (iVar9 == 0) {
            ptVar30 = C->target;
            uVar20 = ptVar30->bits_in_int - 1;
            if ((uVar13 >> ((byte)uVar20 & 0x3f) & 0xfffffffffffffffe) != 0) {
              uVar20 = 1;
LAB_00108322:
              uVar21 = ptVar30->bits_in_long - 1;
              if ((uVar13 >> ((byte)uVar21 & 0x3f) & 0xfffffffffffffffe) != 0) {
                uVar20 = 1;
                goto LAB_0010833b;
              }
              if ((uVar13 >> ((ulong)uVar21 & 0x3f) & 1) == 0) {
                expr = (expression *)0x135927;
                size = 1;
                uVar21 = uVar8;
              }
              else {
                if (!bVar32) {
                  uVar20 = 3;
                  goto LAB_0010833b;
                }
                expr = (expression *)0x135927;
                size = 1;
                uVar21 = size;
              }
              goto LAB_001083c4;
            }
            bVar31 = (uVar13 >> ((ulong)uVar20 & 0x3f) & 1) == 0;
            uVar20 = 1;
            uVar21 = uVar20;
            if (bVar31) {
              uVar21 = uVar8;
            }
            size = 0;
            if (!(bool)(bVar31 | bVar32)) goto LAB_00108322;
          }
          else {
            uVar20 = 0;
            ptVar30 = C->target;
            if (iVar9 == 1) goto LAB_00108322;
LAB_0010833b:
            uVar22 = ptVar30->bits_in_longlong - 1;
            if ((uVar13 >> ((byte)uVar22 & 0x3f) & 0xfffffffffffffffe) != 0) goto LAB_00108521;
            size = 2;
            expr = (expression *)0x139f23;
            uVar21 = uVar8;
            if (((uVar13 >> ((ulong)uVar22 & 0x3f) & 1) != 0) && (uVar21 = 1, !bVar32)) {
              pcVar24 = dmrC_show_token(C,token);
              dmrC_warning(C,peVar11->pos,"decimal constant %s is too big for long long",pcVar24);
              size = 2;
            }
LAB_001083c4:
            if (uVar20 != 0) {
              local_58 = CONCAT44(local_58._4_4_,size);
              pcVar24 = dmrC_show_token(C,token);
              pcVar25 = " unsigned";
              if (uVar21 == 0) {
                pcVar25 = "";
              }
              dmrC_warning(C,peVar11->pos,"constant %s is so big it is%s%s%s",pcVar24,pcVar25,
                           " long",expr);
              if ((uVar20 & 2) != 0) {
                pcVar24 = dmrC_show_token(C,token);
                dmrC_warning(C,peVar11->pos,
                             "decimal constant %s is between LONG_MAX and ULONG_MAX. For C99 that means long long, C90 compilers are very likely to produce unsigned long (and a warning) here"
                             ,pcVar24);
              }
              size = (uint)local_58;
            }
          }
          tree = local_38;
          sVar7 = local_50;
          *(undefined2 *)peVar11 = 0x101;
          psVar18 = dmrC_ctype_integer(C,size,uVar21);
          peVar11->ctype = psVar18;
          (peVar11->field_5).field_0.value = sVar7;
          goto LAB_00107b27;
        }
        if ((bVar1 & 0xdf) == 0x4c) {
          if (iVar9 != 0) break;
          iVar9 = 1;
          bVar31 = bVar19;
          if (*(byte *)local_48 == bVar1) {
            iVar9 = 2;
            local_48 = (expression *)&peVar28->field_0x2;
          }
          goto LAB_00107d0b;
        }
        if ((bVar1 & 0xdf) != 0x55) goto LAB_00107d6b;
        bVar4 = 1;
        uVar8 = 1;
        bVar31 = false;
      } while (bVar19);
LAB_001084fe:
      pcVar24 = dmrC_show_token(C,token);
      pVar12 = peVar11->pos;
      pcVar25 = "constant %s is not a valid number";
LAB_00108514:
      dmrC_error_die(C,pVar12,pcVar25,pcVar24);
    }
LAB_00107d6b:
    dmrC_string_to_ld((longdouble *)peVar16,(char *)&local_48,(char **)local_48);
    (peVar11->field_5).fvalue = in_ST0;
    if (peVar16 == local_48) goto LAB_001084fe;
    cVar2 = *(char *)local_48;
    if (cVar2 == '\0') {
      lVar23 = 0x15c8;
    }
    else {
      if (local_48->field_0x1 != '\0') goto LAB_001084fe;
      lVar23 = 0x14e0;
      if (cVar2 != 'F') {
        if (cVar2 != 'l') {
          if (cVar2 == 'f') goto LAB_0010805e;
          if (cVar2 != 'L') goto LAB_001084fe;
        }
        lVar23 = 0x16b0;
      }
    }
LAB_0010805e:
    peVar11->ctype = (symbol *)((long)&C->S->C + lVar23);
    *(undefined2 *)peVar11 = 0x21c;
    tree = local_38;
    break;
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
    peVar11 = dmrC_alloc_expression(C,pVar12,1);
    peVar11->field_0x1 = 1;
    lVar23 = 0xcb8;
    if ((*(uint *)&token->pos & 0x3e) < 10) {
      lVar23 = 0xa00;
    }
    peVar11->ctype = (symbol *)((long)&C->S->C + lVar23);
    dmrC_get_char_constant(C,token,(unsigned_long_long *)&(peVar11->field_5).statement);
    break;
  case 0xf:
  case 0x10:
    peVar11 = dmrC_alloc_expression(C,pVar12,2);
    pVar12 = (position)dmrC_get_string_constant(C,token,peVar11);
    goto LAB_00107b2c;
  case 0x11:
    if ((token->field_2).special == 0x5b) {
      iVar9 = dmrC_lookup_type(token->next);
      if (iVar9 != 0) {
        peVar11 = dmrC_alloc_expression(C,token->pos,4);
        peVar11->field_0x1 = 1;
        pVar12 = (position)
                 dmrC_typename(C,token->next,(symbol **)&(peVar11->field_5).statement,(int *)0x0);
        pcVar24 = "in type expression";
        iVar9 = 0x5d;
LAB_00107fb7:
        pVar12 = (position)dmrC_expect_token(C,(token *)pVar12,iVar9,pcVar24);
        goto LAB_00107b2c;
      }
    }
    else if ((token->field_2).special == 0x28) {
      peVar11 = dmrC_alloc_expression(C,pVar12,9);
      peVar11->op = 0x28;
      pVar12 = (position)
               dmrC_parens_expression
                         (C,token,(expression **)&(peVar11->field_5).statement,"in expression");
      if ((peVar11->field_5).statement != (statement *)0x0) {
        peVar11->field_0x1 = *(byte *)((long)&((peVar11->field_5).statement)->type + 1);
      }
      goto LAB_00107b2c;
    }
  default:
    peVar11 = (expression *)0x0;
    pVar12 = (position)token;
    goto LAB_00107b2c;
  }
LAB_00107b27:
  pVar12 = (position)token->next;
LAB_00107b2c:
  *tree = peVar11;
  return (token *)pVar12;
}

Assistant:

struct token *dmrC_primary_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	struct expression *expr = NULL;

	switch (dmrC_token_type(token)) {
	case TOKEN_CHAR:
	case TOKEN_CHAR_EMBEDDED_0:
	case TOKEN_CHAR_EMBEDDED_1:
	case TOKEN_CHAR_EMBEDDED_2:
	case TOKEN_CHAR_EMBEDDED_3:
	case TOKEN_WIDE_CHAR:
	case TOKEN_WIDE_CHAR_EMBEDDED_0:
	case TOKEN_WIDE_CHAR_EMBEDDED_1:
	case TOKEN_WIDE_CHAR_EMBEDDED_2:
	case TOKEN_WIDE_CHAR_EMBEDDED_3:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);   
		expr->flags = Int_const_expr;
		expr->ctype = dmrC_token_type(token) < TOKEN_WIDE_CHAR ? &C->S->int_ctype : &C->S->long_ctype;
		dmrC_get_char_constant(C, token, &expr->value);
		token = token->next;
		break;

	case TOKEN_NUMBER:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
		get_number_value(C, expr, token); /* will see if it's an integer */
		token = token->next;
		break;

	case TOKEN_ZERO_IDENT: {
		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);
		expr->flags = Int_const_expr;
		expr->ctype = &C->S->int_ctype;
		expr->symbol = &C->S->zero_int;
		expr->symbol_name = token->ident;
		token = token->next;
		break;
	}

	case TOKEN_IDENT: {
		struct symbol *sym = dmrC_lookup_symbol(token->ident, NS_SYMBOL | NS_TYPEDEF);
		struct token *next = token->next;

		if (!sym) {
			sym = handle_func(C, token);
			if (token->ident == C->S->__builtin_types_compatible_p_ident) {
				token = builtin_types_compatible_p_expr(C, token, &expr);
				break;
			}
			if (token->ident == C->S->__builtin_offsetof_ident) {
				token = builtin_offsetof_expr(C, token, &expr);
				break;
			}
		} else if (sym->enum_member) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_VALUE);
			*expr = *sym->initializer;
			/* we want the right position reported, thus the copy */
			expr->pos = token->pos;
			expr->flags = Int_const_expr;
			token = next;
			break;
		}

		expr = dmrC_alloc_expression(C, token->pos, EXPR_SYMBOL);

		/*
		 * We support types as real first-class citizens, with type
		 * comparisons etc:
		 *
		 *	if (typeof(a) == int) ..
		 */
		if (sym && sym->ns == NS_TYPEDEF) {
			dmrC_sparse_error(C, token->pos, "typename in expression");
			sym = NULL;
		}
		expr->symbol_name = token->ident;
		expr->symbol = sym;
		token = next;
		break;
	}

	case TOKEN_STRING:
	case TOKEN_WIDE_STRING:
		expr = dmrC_alloc_expression(C, token->pos, EXPR_STRING);
		token = dmrC_get_string_constant(C, token, expr);
		break;

	case TOKEN_SPECIAL:
		if (token->special == '(') {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_PREOP);
			expr->op = '(';
			token = dmrC_parens_expression(C, token, &expr->unop, "in expression");
			if (expr->unop)
				expr->flags = expr->unop->flags;
			break;
		}
		if (token->special == '[' && dmrC_lookup_type(token->next)) {
			expr = dmrC_alloc_expression(C, token->pos, EXPR_TYPE);
			expr->flags = Int_const_expr; /* sic */
			token = dmrC_typename(C, token->next, &expr->symbol, NULL);
			token = dmrC_expect_token(C, token, ']', "in type expression");
			break;
		}
			
	default:
		;
	}
	*tree = expr;
	return token;
}